

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O3

RegNum __thiscall
LinearScan::Spill(LinearScan *this,Lifetime *newLifetime,RegOpnd *regOpnd,bool dontSpillCurrent,
                 bool force)

{
  IRType IVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  BVIndex index;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar5;
  undefined1 auVar6 [8];
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  bool bVar8;
  RegNum RVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  Type *ppLVar13;
  Type pLVar14;
  char cVar15;
  undefined7 in_register_00000009;
  undefined1 auStack_a0 [8];
  EditingIterator iter;
  undefined1 auStack_78 [8];
  EditingIterator candidate;
  BitVector local_50;
  uint local_44;
  uint local_34;
  
  candidate.super_EditingIterator.last._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,dontSpillCurrent);
  iter.super_EditingIterator.last = (NodeBase *)newLifetime;
  if (regOpnd == (RegOpnd *)0x0 || newLifetime == (Lifetime *)0x0) {
    if (newLifetime != (Lifetime *)0x0) goto LAB_00586784;
    IVar1 = (regOpnd->super_Opnd).m_type;
    local_34 = 0xffffffff;
    local_44 = 1;
    if (((byte)(IVar1 - TyFloat32) < 2) || (bVar8 = IRType_IsSimd128(IVar1), bVar8)) {
      local_50.word = 0;
      cVar15 = '\0';
    }
    else {
      index = TySize[(regOpnd->super_Opnd).m_type];
      BVUnitT<unsigned_long>::AssertRange(index);
      local_50.word = 1L << ((byte)index & 0x3f);
      cVar15 = '\0';
      local_44 = 0;
    }
  }
  else {
    uVar4 = *(uint *)&newLifetime->field_0x9c;
    IVar1 = (regOpnd->super_Opnd).m_type;
    uVar10 = 1;
    if (IVar1 != TyFloat64) {
      bVar8 = IRType_IsSimd128(IVar1);
      uVar10 = (uint)bVar8;
    }
    if (uVar10 != (uVar4 >> 0xd & 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xac1,
                         "(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()))"
                         ,
                         "!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128())"
                        );
      if (!bVar8) goto LAB_00586a77;
      *puVar12 = 0;
    }
LAB_00586784:
    uVar2 = *(ushort *)&newLifetime->field_0x9c;
    local_34 = 0xffffffff;
    uVar3 = uVar2;
    if (!force) {
      local_34 = GetSpillCost(this,newLifetime);
      uVar3 = *(ushort *)&newLifetime->field_0x9c;
    }
    local_50.word = (newLifetime->intUsageBv).word;
    local_44 = uVar2 >> 0xd & 1;
    cVar15 = (char)((uVar3 & 4) >> 2);
  }
  auStack_78 = (undefined1  [8])0x0;
  candidate.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  candidate.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  auStack_a0 = (undefined1  [8])this->activeLiveranges;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)auStack_a0;
  bVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                    ((EditingIterator *)auStack_a0);
  if (bVar8) {
    do {
      ppLVar13 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)auStack_a0);
      uVar11 = GetSpillCost(this,*ppLVar13);
      if ((uVar11 < local_34) &&
         (RVar9 = (*ppLVar13)->reg, BVUnitT<unsigned_long>::AssertRange((uint)RVar9),
         ((this->instrUseRegs).word >> ((ulong)RVar9 & 0x3f) & 1) == 0)) {
        pLVar14 = *ppLVar13;
        if ((-1 < (char)*(uint *)&pLVar14->field_0x9c) &&
           (local_44 == (*(uint *)&pLVar14->field_0x9c >> 0xd & 1))) {
          if (cVar15 != '\0') {
            RVar9 = pLVar14->reg;
            BVUnitT<unsigned_long>::AssertRange((uint)RVar9);
            if (((this->calleeSavedRegs).word >> ((ulong)RVar9 & 0x3f) & 1) == 0) goto LAB_00586852;
            pLVar14 = *ppLVar13;
          }
          bVar8 = LinearScanMD::FitRegIntSizeConstraints(&this->linearScanMD,pLVar14->reg,local_50);
          if (bVar8) {
            candidate.super_EditingIterator.super_Iterator.current =
                 iter.super_EditingIterator.super_Iterator.current;
            auStack_78 = auStack_a0;
            candidate.super_EditingIterator.super_Iterator.list =
                 iter.super_EditingIterator.super_Iterator.list;
            local_34 = uVar11;
          }
        }
      }
LAB_00586852:
      bVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)auStack_a0);
    } while (bVar8);
  }
  pSVar7 = candidate.super_EditingIterator.super_Iterator.list;
  auVar6 = auStack_78;
  pLVar14 = (Type)iter.super_EditingIterator.last;
  if ((iter.super_EditingIterator.last == (NodeBase *)0x0) &&
     (candidate.super_EditingIterator.super_Iterator.list ==
      (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0 ||
      (undefined1  [8])candidate.super_EditingIterator.super_Iterator.list == auStack_78)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xaf1,"(newLifetime || candidate.IsValid())",
                       "Didn\'t find anything to spill?!?");
    if (!bVar8) {
LAB_00586a77:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar12 = 0;
  }
  if ((pSVar7 == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     ((undefined1  [8])pSVar7 == auVar6)) {
    if (candidate.super_EditingIterator.last._4_1_ != '\0') {
      return RegNOREG;
    }
  }
  else {
    ppLVar13 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)auStack_78);
    pSVar7 = candidate.super_EditingIterator.super_Iterator.list;
    pLVar14 = *ppLVar13;
    this_00 = *(ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> **)
               ((long)auStack_78 + 0x10);
    SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
              ((EditingIterator *)auStack_78);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (this_00,pSVar7,0x10);
    RVar9 = pLVar14->reg;
    BVUnitT<unsigned_long>::AssertRange((uint)RVar9);
    RVar9 = RVar9 & (RegXMM15|RegXMM14);
    (this->activeRegs).word =
         (this->activeRegs).word & (-2L << RVar9 | 0xfffffffffffffffeU >> 0x40 - RVar9);
    if ((pLVar14->field_0x9d & 0x20) == 0) {
      this->intRegUsedCount = this->intRegUsedCount - 1;
    }
    else {
      this->floatRegUsedCount = this->floatRegUsedCount - 1;
    }
  }
  RVar9 = SpillLiveRange(this,pLVar14,(Instr *)0x0);
  return RVar9;
}

Assistant:

RegNum
LinearScan::Spill(Lifetime *newLifetime, IR::RegOpnd *regOpnd, bool dontSpillCurrent, bool force)
{
    uint minSpillCost = (uint)-1;

    Assert(!newLifetime || !regOpnd || newLifetime->isFloat == (regOpnd->GetType() == TyMachDouble || regOpnd->IsSimd128()));
    bool isFloatReg;
    BitVector intUsageBV;
    bool needCalleeSaved;

    // For now, we just spill the lifetime with the lowest spill cost.
    if (newLifetime)
    {
        isFloatReg = newLifetime->isFloat;

        if (!force)
        {
            minSpillCost = this->GetSpillCost(newLifetime);
        }
        intUsageBV = newLifetime->intUsageBv;
        needCalleeSaved = newLifetime->isLiveAcrossUserCalls;
    }
    else
    {
        needCalleeSaved = false;
        if (regOpnd->IsFloat() || regOpnd->IsSimd128())
        {
            isFloatReg = true;
        }
        else
        {
            // Filter for int reg size constraints
            isFloatReg = false;
            intUsageBV.ClearAll();
            intUsageBV.Set(TySize[regOpnd->GetType()]);
        }
    }

    SList<Lifetime *>::EditingIterator candidate;
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, this->activeLiveranges, iter)
    {
        uint spillCost = this->GetSpillCost(lifetime);
        if (spillCost < minSpillCost                        &&
            this->instrUseRegs.Test(lifetime->reg) == false &&
            lifetime->isFloat == isFloatReg &&
            !lifetime->cantSpill                            &&
            (!needCalleeSaved || this->calleeSavedRegs.Test(lifetime->reg)) &&
            this->linearScanMD.FitRegIntSizeConstraints(lifetime->reg, intUsageBV))
        {
            minSpillCost = spillCost;
            candidate = iter;
        }
    } NEXT_SLIST_ENTRY_EDITING;
    AssertMsg(newLifetime || candidate.IsValid(), "Didn't find anything to spill?!?");

    Lifetime * spilledRange;
    if (candidate.IsValid())
    {
        spilledRange = candidate.Data();
        candidate.RemoveCurrent();

        this->activeRegs.Clear(spilledRange->reg);
        if (spilledRange->IsInt())
        {
            this->intRegUsedCount--;
        }
        else
        {
            this->floatRegUsedCount--;
        }
    }
    else if (dontSpillCurrent)
    {
        return RegNOREG;
    }
    else
    {
        spilledRange = newLifetime;
    }

    return this->SpillLiveRange(spilledRange);
}